

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O2

int __thiscall FastPForLib::ZipfianGenerator::init(ZipfianGenerator *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  uint extraout_EAX;
  uint uVar4;
  runtime_error *this_00;
  uint32_t nn;
  ulong uVar5;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  undefined1 in_XMM2 [16];
  value_type_conflict local_20;
  
  nn = (uint32_t)ctx;
  this->n = nn;
  if (nn != 0) {
    this->theta = in_XMM0_Qa;
    if (in_XMM0_Qa <= 0.0) {
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,nn);
      local_20 = 1.0 / auVar3._0_8_;
      std::vector<double,_std::allocator<double>_>::resize
                (&this->proba,(ulong)ctx & 0xffffffff,&local_20);
      uVar4 = extraout_EAX;
    }
    else {
      dVar6 = zeta(this,nn,in_XMM0_Qa);
      this->zetan = 1.0 / dVar6;
      pdVar2 = (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar2) {
        (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar2;
      }
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(&this->proba,(ulong)this->n,&local_20);
      dVar6 = this->zetan;
      *(this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = dVar6;
      uVar5 = 1;
      while (uVar4 = this->n, uVar5 < uVar4) {
        dVar1 = this->zetan;
        auVar3 = vcvtusi2sd_avx512f(in_XMM2,(int)(uVar5 + 1));
        dVar7 = pow(auVar3._0_8_,this->theta);
        dVar6 = dVar6 + dVar1 / dVar7;
        (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = dVar6;
        uVar5 = uVar5 + 1;
      }
    }
    return uVar4;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"no items?");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(int _items, double _zipfianconstant = 1.0) {
    n = _items;
    if (_items == 0)
      throw std::runtime_error("no items?");
    theta = _zipfianconstant;
    if (theta > 0) {
      zetan = 1 / zeta(n, theta);
      proba.clear();
      proba.resize(n, 0);
      proba[0] = zetan;
      for (uint32_t i = 1; i < n; ++i)
        proba[i] = proba[i - 1] + zetan / pow(i + 1, theta);
    } else {
      proba.resize(n, 1.0 / n);
    }
  }